

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

AActor * P_SpawnPuff(AActor *source,PClassActor *pufftype,DVector3 *pos1,DAngle *hitdir,
                    DAngle *particledir,int updown,int flags,AActor *vict)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  FSoundID local_a8;
  FSoundID local_a4;
  TAngle<double> local_a0;
  TFlags<ActorFlag4,_unsigned_int> local_98;
  FName local_94;
  FName local_90;
  FName local_8c;
  FState *local_88;
  FState *crashstate;
  TFlags<ActorFlag5,_unsigned_int> local_74;
  TFlags<ActorFlag7,_unsigned_int> local_70;
  TFlags<ActorFlag7,_unsigned_int> local_6c;
  TFlags<ActorFlag7,_unsigned_int> local_68;
  TFlags<ActorFlag4,_unsigned_int> local_64;
  undefined1 local_60 [8];
  DVector3 pos;
  AActor *puff;
  int updown_local;
  DAngle *particledir_local;
  DAngle *hitdir_local;
  DVector3 *pos1_local;
  PClassActor *pufftype_local;
  AActor *source_local;
  
  TVector3<double>::TVector3((TVector3<double> *)local_60,pos1);
  if ((flags & 0x10U) == 0) {
    iVar2 = FRandom::Random2(&pr_spawnpuff);
    pos.Y = (double)iVar2 / 64.0 + pos.Y;
  }
  pos.Z = (double)Spawn(pufftype,(DVector3 *)local_60,ALLOW_REPLACE);
  if ((AActor *)pos.Z == (AActor *)0x0) {
    source_local = (AActor *)0x0;
  }
  else {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_64,
               SUB84(pos.Z,0) + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
    bVar4 = false;
    if (uVar3 != 0) {
      bVar4 = 0 < *(int *)((long)pos.Z + 0x170);
    }
    if (bVar4) {
      uVar3 = FRandom::operator()(&pr_spawnpuff);
      *(uint *)((long)pos.Z + 0x170) = *(int *)((long)pos.Z + 0x170) - (uVar3 & 3);
      if (*(int *)((long)pos.Z + 0x170) < 1) {
        *(undefined4 *)((long)pos.Z + 0x170) = 1;
      }
    }
    if ((pos.Z != 0.0) && (vict != (AActor *)0x0)) {
      TFlags<ActorFlag7,_unsigned_int>::operator&
                (&local_68,
                 SUB84(pos.Z,0) + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG)
                );
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_68);
      if (uVar3 != 0) {
        TObjPtr<AActor>::operator=((TObjPtr<AActor> *)((long)pos.Z + 0x1d8),vict);
      }
      TFlags<ActorFlag7,_unsigned_int>::operator&
                (&local_6c,
                 SUB84(pos.Z,0) + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG)
                );
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
      if (uVar3 != 0) {
        TObjPtr<AActor>::operator=((TObjPtr<AActor> *)((long)pos.Z + 0x250),vict);
      }
      TFlags<ActorFlag7,_unsigned_int>::operator&
                (&local_70,
                 SUB84(pos.Z,0) + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|MF7_ALWAYSTELEFRAG)
                );
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
      if (uVar3 != 0) {
        TObjPtr<AActor>::operator=((TObjPtr<AActor> *)((long)pos.Z + 0x248),vict);
      }
    }
    bVar4 = false;
    if (pos.Z != 0.0) {
      TFlags<ActorFlag5,_unsigned_int>::operator&
                (&local_74,
                 SUB84(pos.Z,0) +
                 (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|MF5_NODROPOFF));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_74);
      bVar4 = uVar3 != 0;
    }
    if (bVar4) {
      TObjPtr<AActor>::operator=((TObjPtr<AActor> *)((long)pos.Z + 0x1d8),source);
    }
    TAngle<double>::operator+((TAngle<double> *)&crashstate,180.0);
    TAngle<double>::operator=((TAngle<double> *)((long)pos.Z + 0x90),(TAngle<double> *)&crashstate);
    dVar1 = pos.Z;
    bVar4 = false;
    if ((flags & 1U) == 0) {
      FName::FName(&local_8c,NAME_Crash);
      local_88 = AActor::FindState((AActor *)dVar1,&local_8c);
      bVar4 = local_88 != (FState *)0x0;
    }
    dVar1 = pos.Z;
    if (bVar4) {
      AActor::SetState((AActor *)pos.Z,local_88,false);
    }
    else {
      bVar4 = false;
      if ((flags & 8U) != 0) {
        FName::FName(&local_90,NAME_Death);
        FName::FName(&local_94,NAME_Extreme);
        local_88 = AActor::FindState((AActor *)dVar1,&local_90,&local_94,true);
        bVar4 = local_88 != (FState *)0x0;
      }
      if (bVar4) {
        AActor::SetState((AActor *)pos.Z,local_88,false);
      }
      else if (((flags & 2U) != 0) && (*(long *)((long)pos.Z + 0x418) != 0)) {
        AActor::SetState((AActor *)pos.Z,*(FState **)((long)pos.Z + 0x418),false);
      }
    }
    if ((flags & 4U) == 0) {
      iVar2 = FIntCVar::operator_cast_to_int(&cl_pufftype);
      bVar4 = false;
      if ((iVar2 != 0) && (bVar4 = false, updown != 3)) {
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  (&local_98,
                   SUB84(pos.Z,0) + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH)
                  );
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_98);
        bVar4 = uVar3 != 0;
      }
      if (bVar4) {
        TAngle<double>::TAngle(&local_a0,particledir);
        P_DrawSplash2(0x20,(DVector3 *)local_60,&local_a0,updown,1);
        TFlags<ActorRenderFlag,_unsigned_int>::operator|=
                  ((TFlags<ActorRenderFlag,_unsigned_int> *)((long)pos.Z + 0xec),RF_INVISIBLE);
      }
      if (((flags & 1U) == 0) ||
         (iVar2 = FSoundID::operator_cast_to_int((FSoundID *)((long)pos.Z + 900)), dVar1 = pos.Z,
         iVar2 == 0)) {
        iVar2 = FSoundID::operator_cast_to_int((FSoundID *)((long)pos.Z + 0x388));
        dVar1 = pos.Z;
        if (iVar2 != 0) {
          FSoundID::FSoundID(&local_a8,(FSoundID *)((long)pos.Z + 0x388));
          S_Sound((AActor *)dVar1,4,&local_a8,1.0,1.0);
        }
      }
      else {
        FSoundID::FSoundID(&local_a4,(FSoundID *)((long)pos.Z + 900));
        S_Sound((AActor *)dVar1,4,&local_a4,1.0,1.0);
      }
    }
    source_local = (AActor *)pos.Z;
  }
  return source_local;
}

Assistant:

AActor *P_SpawnPuff (AActor *source, PClassActor *pufftype, const DVector3 &pos1, DAngle hitdir, DAngle particledir, int updown, int flags, AActor *vict)
{
	AActor *puff;
	DVector3 pos = pos1;

	if (!(flags & PF_NORANDOMZ)) pos.Z += pr_spawnpuff.Random2() / 64.;
	puff = Spawn(pufftype, pos, ALLOW_REPLACE);
	if (puff == NULL) return NULL;

	if ((puff->flags4 & MF4_RANDOMIZE) && puff->tics > 0)
	{
		puff->tics -= pr_spawnpuff() & 3;
		if (puff->tics < 1)
			puff->tics = 1;
	}

	//Moved puff creation and target/master/tracer setting to here. 
	if (puff && vict)
	{
		if (puff->flags7 & MF7_HITTARGET)	puff->target = vict;
		if (puff->flags7 & MF7_HITMASTER)	puff->master = vict;
		if (puff->flags7 & MF7_HITTRACER)	puff->tracer = vict;
	}
	// [BB] If the puff came from a player, set the target of the puff to this player.
	if ( puff && (puff->flags5 & MF5_PUFFGETSOWNER))
		puff->target = source;
	
	// Angle is the opposite of the hit direction (i.e. the puff faces the source.)
	puff->Angles.Yaw = hitdir + 180;

	// If a puff has a crash state and an actor was not hit,
	// it will enter the crash state. This is used by the StrifeSpark
	// and BlasterPuff.
	FState *crashstate;
	if (!(flags & PF_HITTHING) && (crashstate = puff->FindState(NAME_Crash)) != NULL)
	{
		puff->SetState (crashstate);
	}
	else if ((flags & PF_HITTHINGBLEED) && (crashstate = puff->FindState(NAME_Death, NAME_Extreme, true)) != NULL)
	{
		puff->SetState (crashstate);
	}
	else if ((flags & PF_MELEERANGE) && puff->MeleeState != NULL)
	{
		// handle the hard coded state jump of Doom's bullet puff
		// in a more flexible manner.
		puff->SetState (puff->MeleeState);
	}

	if (!(flags & PF_TEMPORARY))
	{
		if (cl_pufftype && updown != 3 && (puff->flags4 & MF4_ALLOWPARTICLES))
		{
			P_DrawSplash2 (32, pos, particledir, updown, 1);
			puff->renderflags |= RF_INVISIBLE;
		}

		if ((flags & PF_HITTHING) && puff->SeeSound)
		{ // Hit thing sound
			S_Sound (puff, CHAN_BODY, puff->SeeSound, 1, ATTN_NORM);
		}
		else if (puff->AttackSound)
		{
			S_Sound (puff, CHAN_BODY, puff->AttackSound, 1, ATTN_NORM);
		}
	}

	return puff;
}